

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O1

void __thiscall
http_version_parsing_invalid02_Test::TestBody(http_version_parsing_invalid02_Test *this)

{
  bool bVar1;
  sub_string str;
  AssertHelper AStack_38;
  sub_string local_30;
  sub_string local_20;
  
  sub_string::sub_string(&local_30,"","");
  local_20.begin_ = local_30.begin_;
  local_20.end_ = local_30.end_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    parse_request_method(&local_20);
  }
  testing::Message::Message((Message *)&local_30);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
             ,0x6d,
             "Expected: parse_request_method(str) throws an exception of type http_parsing_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&AStack_38);
  if ((((long *)local_30.begin_ != (long *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1))
     && ((long *)local_30.begin_ != (long *)0x0)) {
    (**(code **)(*(long *)local_30.begin_ + 8))();
  }
  return;
}

Assistant:

TEST(http_request_method_parsing, invalid02)
{
    sub_string str = sub_string::literal("");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}